

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O2

int32_t __thiscall icu_63::CollationSettings::hashCode(CollationSettings *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = this->options & 0xc;
  if (uVar2 != 0) {
    uVar2 = this->variableTop;
  }
  uVar1 = this->reorderCodesLength;
  uVar2 = this->options << 8 ^ uVar1 ^ uVar2;
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = uVar2 ^ this->reorderCodes[uVar3] << ((byte)uVar3 & 0x1f);
  }
  return uVar2;
}

Assistant:

int32_t
CollationSettings::hashCode() const {
    int32_t h = options << 8;
    if((options & ALTERNATE_MASK) != 0) { h ^= variableTop; }
    h ^= reorderCodesLength;
    for(int32_t i = 0; i < reorderCodesLength; ++i) {
        h ^= (reorderCodes[i] << i);
    }
    return h;
}